

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Type::write_widget_code(Fl_Widget_Type *this)

{
  uchar uVar1;
  uchar uVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  Fl_Boxtype FVar6;
  Fl_Boxtype FVar7;
  Fl_Color FVar8;
  Fl_Color FVar9;
  Fl_Labeltype FVar10;
  Fl_Labeltype FVar11;
  Fl_Font FVar12;
  Fl_Font FVar13;
  uint uVar14;
  Fl_Fontsize FVar15;
  Fl_Fontsize FVar16;
  Fl_Align FVar17;
  Fl_Align FVar18;
  Fl_When FVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  undefined4 extraout_var;
  Fl_Group *pFVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  char *local_c0;
  char *local_b0;
  char *local_a8;
  Fl_When local_98;
  Fl_When ww;
  int i;
  char *ud;
  Fl_Color c;
  int s;
  Fl_Font f_2;
  Fl_Color fc;
  int fs;
  Fl_Font ff;
  Fl_Spinner *f_1;
  Fl_Spinner *v_1;
  double y;
  double x;
  Fl_Valuator *f;
  Fl_Valuator *v;
  Fl_Menu_ *b_2;
  Fl_Input_Choice *b_1;
  Fl_Button *b;
  char *pcStack_20;
  int shortcut;
  char *var;
  Fl_Widget *tplate;
  Fl_Widget_Type *this_local;
  
  var = (char *)(this->super_Fl_Type).factory[1].prev;
  tplate = (Fl_Widget *)this;
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x26])();
  if (iVar5 == 0) {
    pcVar20 = Fl_Type::name(&this->super_Fl_Type);
    if (pcVar20 == (char *)0x0) {
      local_b0 = "o";
    }
    else {
      local_b0 = Fl_Type::name(&this->super_Fl_Type);
    }
    local_a8 = local_b0;
  }
  else {
    local_a8 = "this";
  }
  pcStack_20 = local_a8;
  pcVar20 = tooltip(this);
  if ((pcVar20 != (char *)0x0) && (pcVar20 = tooltip(this), *pcVar20 != '\0')) {
    pcVar20 = indent();
    write_c("%s%s->tooltip(",pcVar20,pcStack_20);
    pcVar20 = i18n_set;
    if (i18n_type == 0) {
      pcVar20 = tooltip(this);
      write_cstring(pcVar20);
    }
    else if (i18n_type == 1) {
      write_c("%s(",i18n_function);
      pcVar20 = tooltip(this);
      write_cstring(pcVar20);
      write_c(")");
    }
    else if (i18n_type == 2) {
      if (*i18n_file == '\0') {
        local_c0 = "_catalog";
      }
      else {
        local_c0 = i18n_file;
      }
      iVar5 = Fl_Type::msgnum(&this->super_Fl_Type);
      write_c("catgets(%s,%s,%d,",local_c0,pcVar20,(ulong)(iVar5 + 1));
      pcVar20 = tooltip(this);
      write_cstring(pcVar20);
      write_c(")");
    }
    write_c(");\n");
  }
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])();
  if (iVar5 != 0) {
    uVar1 = Fl_Spinner::type((Fl_Spinner *)this->o);
    uVar2 = Fl_Spinner::type((Fl_Spinner *)var);
    if (uVar1 != uVar2) {
      pcVar21 = indent();
      pcVar20 = pcStack_20;
      bVar3 = Fl_Spinner::type((Fl_Spinner *)this->o);
      write_c("%s%s->type(%d);\n",pcVar21,pcVar20,(ulong)bVar3);
      goto LAB_0019fee9;
    }
  }
  uVar1 = Fl_Widget::type(this->o);
  uVar2 = Fl_Widget::type((Fl_Widget *)var);
  if ((uVar1 != uVar2) && (iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(), iVar5 == 0)) {
    pcVar21 = indent();
    pcVar20 = pcStack_20;
    bVar3 = Fl_Widget::type(this->o);
    write_c("%s%s->type(%d);\n",pcVar21,pcVar20,(ulong)bVar3);
  }
LAB_0019fee9:
  FVar6 = Fl_Widget::box(this->o);
  FVar7 = Fl_Widget::box((Fl_Widget *)var);
  if ((FVar6 != FVar7) || (pcVar20 = subclass(this), pcVar20 != (char *)0x0)) {
    pcVar21 = indent();
    pcVar20 = pcStack_20;
    FVar6 = Fl_Widget::box(this->o);
    pcVar22 = boxname(FVar6);
    write_c("%s%s->box(FL_%s);\n",pcVar21,pcVar20,pcVar22);
  }
  b._4_4_ = 0;
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])();
  if (iVar5 == 0) {
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])();
    if (iVar5 == 0) {
      iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])();
      if (iVar5 == 0) {
        iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])();
        if (iVar5 != 0) {
          b._4_4_ = Fl_Text_Display::shortcut((Fl_Text_Display *)this->o);
        }
      }
      else {
        b._4_4_ = Fl_Value_Input::shortcut((Fl_Value_Input *)this->o);
      }
    }
    else {
      b._4_4_ = Fl_Input_::shortcut((Fl_Input_ *)this->o);
    }
  }
  else {
    b._4_4_ = Fl_Button::shortcut((Fl_Button *)this->o);
  }
  if (b._4_4_ != 0) {
    if ((use_FL_COMMAND == 0) || ((b._4_4_ & 0x440000) == 0)) {
      pcVar20 = indent();
      write_c("%s%s->shortcut(0x%x);\n",pcVar20,pcStack_20,(ulong)b._4_4_);
    }
    else {
      pcVar20 = indent();
      write_c("%s%s->shortcut(FL_COMMAND|0x%x);\n",pcVar20,pcStack_20,(ulong)(b._4_4_ & 0xffbbffff))
      ;
    }
  }
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])();
  if (iVar5 == 0) {
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])();
    iVar5 = strcmp((char *)CONCAT44(extraout_var,iVar5),"Fl_Input_Choice");
    if (iVar5 == 0) {
      b_2 = (Fl_Menu_ *)this->o;
      FVar6 = Fl_Input_Choice::down_box((Fl_Input_Choice *)b_2);
      if (FVar6 != FL_NO_BOX) {
        pcVar21 = indent();
        pcVar20 = pcStack_20;
        FVar6 = Fl_Input_Choice::down_box((Fl_Input_Choice *)b_2);
        pcVar22 = boxname(FVar6);
        write_c("%s%s->down_box(FL_%s);\n",pcVar21,pcVar20,pcVar22);
      }
    }
    else {
      iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1f])();
      if (iVar5 != 0) {
        v = (Fl_Valuator *)this->o;
        FVar6 = Fl_Menu_::down_box((Fl_Menu_ *)v);
        if (FVar6 != FL_NO_BOX) {
          pcVar21 = indent();
          pcVar20 = pcStack_20;
          FVar6 = Fl_Menu_::down_box((Fl_Menu_ *)v);
          pcVar22 = boxname(FVar6);
          write_c("%s%s->down_box(FL_%s);\n",pcVar21,pcVar20,pcVar22);
        }
      }
    }
  }
  else {
    b_1 = (Fl_Input_Choice *)this->o;
    FVar6 = Fl_Button::down_box((Fl_Button *)b_1);
    if (FVar6 != FL_NO_BOX) {
      pcVar21 = indent();
      pcVar20 = pcStack_20;
      FVar6 = Fl_Button::down_box((Fl_Button *)b_1);
      pcVar22 = boxname(FVar6);
      write_c("%s%s->down_box(FL_%s);\n",pcVar21,pcVar20,pcVar22);
    }
    cVar4 = Fl_Button::value((Fl_Button *)b_1);
    if (cVar4 != '\0') {
      pcVar20 = indent();
      write_c("%s%s->value(1);\n",pcVar20,pcStack_20);
    }
  }
  FVar8 = Fl_Widget::color(this->o);
  FVar9 = Fl_Widget::color((Fl_Widget *)var);
  if ((FVar8 != FVar9) || (pcVar20 = subclass(this), pcVar20 != (char *)0x0)) {
    FVar8 = Fl_Widget::color(this->o);
    write_color(this,"color",FVar8);
  }
  FVar8 = Fl_Widget::selection_color(this->o);
  FVar9 = Fl_Widget::selection_color((Fl_Widget *)var);
  if ((FVar8 != FVar9) || (pcVar20 = subclass(this), pcVar20 != (char *)0x0)) {
    FVar8 = Fl_Widget::selection_color(this->o);
    write_color(this,"selection_color",FVar8);
  }
  if (this->image != (Fluid_Image *)0x0) {
    Fluid_Image::write_code(this->image,pcStack_20,0);
  }
  if (this->inactive != (Fluid_Image *)0x0) {
    Fluid_Image::write_code(this->inactive,pcStack_20,1);
  }
  FVar10 = Fl_Widget::labeltype(this->o);
  FVar11 = Fl_Widget::labeltype((Fl_Widget *)var);
  if ((FVar10 != FVar11) || (pcVar20 = subclass(this), pcVar20 != (char *)0x0)) {
    pcVar21 = indent();
    pcVar20 = pcStack_20;
    FVar10 = Fl_Widget::labeltype(this->o);
    pcVar22 = item_name(labeltypemenu,FVar10);
    write_c("%s%s->labeltype(FL_%s);\n",pcVar21,pcVar20,pcVar22);
  }
  FVar12 = Fl_Widget::labelfont(this->o);
  FVar13 = Fl_Widget::labelfont((Fl_Widget *)var);
  if ((FVar12 != FVar13) || (pcVar20 = subclass(this), pcVar20 != (char *)0x0)) {
    pcVar21 = indent();
    pcVar20 = pcStack_20;
    uVar14 = Fl_Widget::labelfont(this->o);
    write_c("%s%s->labelfont(%d);\n",pcVar21,pcVar20,(ulong)uVar14);
  }
  FVar15 = Fl_Widget::labelsize(this->o);
  FVar16 = Fl_Widget::labelsize((Fl_Widget *)var);
  if ((FVar15 != FVar16) || (pcVar20 = subclass(this), pcVar20 != (char *)0x0)) {
    pcVar21 = indent();
    pcVar20 = pcStack_20;
    uVar14 = Fl_Widget::labelsize(this->o);
    write_c("%s%s->labelsize(%d);\n",pcVar21,pcVar20,(ulong)uVar14);
  }
  FVar8 = Fl_Widget::labelcolor(this->o);
  FVar9 = Fl_Widget::labelcolor((Fl_Widget *)var);
  if ((FVar8 != FVar9) || (pcVar20 = subclass(this), pcVar20 != (char *)0x0)) {
    FVar8 = Fl_Widget::labelcolor(this->o);
    write_color(this,"labelcolor",FVar8);
  }
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])();
  if (iVar5 != 0) {
    f = (Fl_Valuator *)this->o;
    x = (double)var;
    dVar25 = Fl_Valuator::minimum(f);
    dVar26 = Fl_Valuator::minimum((Fl_Valuator *)x);
    if ((dVar25 != dVar26) || (NAN(dVar25) || NAN(dVar26))) {
      pcVar21 = indent();
      pcVar20 = pcStack_20;
      Fl_Valuator::minimum(f);
      write_c("%s%s->minimum(%g);\n",pcVar21,pcVar20);
    }
    dVar25 = Fl_Valuator::maximum(f);
    dVar26 = Fl_Valuator::maximum((Fl_Valuator *)x);
    if ((dVar25 != dVar26) || (NAN(dVar25) || NAN(dVar26))) {
      pcVar21 = indent();
      pcVar20 = pcStack_20;
      Fl_Valuator::maximum(f);
      write_c("%s%s->maximum(%g);\n",pcVar21,pcVar20);
    }
    dVar25 = Fl_Valuator::step(f);
    dVar26 = Fl_Valuator::step((Fl_Valuator *)x);
    if ((dVar25 != dVar26) || (NAN(dVar25) || NAN(dVar26))) {
      pcVar21 = indent();
      pcVar20 = pcStack_20;
      Fl_Valuator::step(f);
      write_c("%s%s->step(%g);\n",pcVar21,pcVar20);
    }
    dVar25 = Fl_Valuator::value(f);
    if ((dVar25 != 0.0) || (NAN(dVar25))) {
      iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])();
      if (iVar5 == 3) {
        pcVar21 = indent();
        pcVar20 = pcStack_20;
        Fl_Valuator::value(f);
        write_c("%s%s->Fl_Slider::value(%g);\n",pcVar21,pcVar20);
      }
      else {
        pcVar21 = indent();
        pcVar20 = pcStack_20;
        Fl_Valuator::value(f);
        write_c("%s%s->value(%g);\n",pcVar21,pcVar20);
      }
    }
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (1 < iVar5) {
      fVar24 = Fl_Slider::slider_size((Fl_Slider *)f);
      y = (double)fVar24;
      fVar24 = Fl_Slider::slider_size((Fl_Slider *)x);
      v_1 = (Fl_Spinner *)(double)fVar24;
      if ((y != (double)v_1) || (NAN(y) || NAN((double)v_1))) {
        pcVar20 = indent();
        write_c("%s%s->slider_size(%g);\n",y,pcVar20,pcStack_20);
      }
    }
  }
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])();
  if (iVar5 != 0) {
    f_1 = (Fl_Spinner *)this->o;
    _fs = (Fl_Spinner *)var;
    dVar25 = Fl_Spinner::minimum(f_1);
    dVar26 = Fl_Spinner::minimum(_fs);
    if ((dVar25 != dVar26) || (NAN(dVar25) || NAN(dVar26))) {
      pcVar21 = indent();
      pcVar20 = pcStack_20;
      Fl_Spinner::minimum(f_1);
      write_c("%s%s->minimum(%g);\n",pcVar21,pcVar20);
    }
    dVar25 = Fl_Spinner::maximum(f_1);
    dVar26 = Fl_Spinner::maximum(_fs);
    if ((dVar25 != dVar26) || (NAN(dVar25) || NAN(dVar26))) {
      pcVar21 = indent();
      pcVar20 = pcStack_20;
      Fl_Spinner::maximum(f_1);
      write_c("%s%s->maximum(%g);\n",pcVar21,pcVar20);
    }
    dVar25 = Fl_Spinner::step(f_1);
    dVar26 = Fl_Spinner::step(_fs);
    if ((dVar25 != dVar26) || (NAN(dVar25) || NAN(dVar26))) {
      pcVar21 = indent();
      pcVar20 = pcStack_20;
      Fl_Spinner::step(f_1);
      write_c("%s%s->step(%g);\n",pcVar21,pcVar20);
    }
    dVar25 = Fl_Spinner::value(f_1);
    if ((dVar25 != 1.0) || (NAN(dVar25))) {
      pcVar21 = indent();
      pcVar20 = pcStack_20;
      Fl_Spinner::value(f_1);
      write_c("%s%s->value(%g);\n",pcVar21,pcVar20);
    }
  }
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,4,&fc,&f_2,&s);
  if (iVar5 != 0) {
    (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,0,&c,(long)&ud + 4,&ud);
    if (c != fc) {
      pcVar20 = indent();
      write_c("%s%s->textfont(%d);\n",pcVar20,pcStack_20,(ulong)c);
    }
    if (ud._4_4_ != f_2) {
      pcVar20 = indent();
      write_c("%s%s->textsize(%d);\n",pcVar20,pcStack_20,(ulong)ud._4_4_);
    }
    if ((Fl_Color)ud != s) {
      write_color(this,"textcolor",(Fl_Color)ud);
    }
  }
  _ww = Fl_Type::user_data(&this->super_Fl_Type);
  pcVar20 = Fl_Type::class_name(&this->super_Fl_Type,1);
  if ((pcVar20 != (char *)0x0) &&
     (iVar5 = (*((this->super_Fl_Type).parent)->_vptr_Fl_Type[0x17])(), iVar5 == 0)) {
    _ww = "this";
  }
  pcVar20 = Fl_Type::callback(&this->super_Fl_Type);
  if (pcVar20 == (char *)0x0) {
    if (_ww != (char *)0x0) {
      pcVar20 = indent();
      write_c("%s%s->user_data((void*)(%s));\n",pcVar20,pcStack_20,_ww);
    }
  }
  else {
    pcVar21 = indent();
    pcVar20 = pcStack_20;
    pcVar22 = Fl_Type::callback_name(&this->super_Fl_Type);
    write_c("%s%s->callback((Fl_Callback*)%s",pcVar21,pcVar20,pcVar22);
    if (_ww == (char *)0x0) {
      write_c(");\n");
    }
    else {
      write_c(", (void*)(%s));\n",_ww);
    }
  }
  FVar17 = Fl_Widget::align(this->o);
  FVar18 = Fl_Widget::align((Fl_Widget *)var);
  if ((FVar17 != FVar18) || (pcVar20 = subclass(this), pcVar20 != (char *)0x0)) {
    FVar17 = Fl_Widget::align(this->o);
    pcVar21 = indent();
    pcVar20 = pcStack_20;
    pcVar22 = item_name(alignmenu,FVar17 & 0xffffffef);
    write_c("%s%s->align(Fl_Align(%s",pcVar21,pcVar20,pcVar22);
    if ((FVar17 & 0x10) != 0) {
      write_c("|FL_ALIGN_INSIDE");
    }
    write_c("));\n");
  }
  local_98 = Fl_Widget::when(this->o);
  if (local_98 == FL_WHEN_NOT_CHANGED) {
    local_98 = FL_WHEN_NEVER;
  }
  FVar19 = Fl_Widget::when((Fl_Widget *)var);
  if ((local_98 != FVar19) || (pcVar20 = subclass(this), pcVar20 != (char *)0x0)) {
    pcVar21 = indent();
    pcVar20 = pcStack_20;
    pcVar22 = item_name(whensymbolmenu,local_98);
    write_c("%s%s->when(%s);\n",pcVar21,pcVar20,pcVar22);
  }
  uVar14 = Fl_Widget::visible(this->o);
  if ((uVar14 == 0) && (pFVar23 = Fl_Widget::parent(this->o), pFVar23 != (Fl_Group *)0x0)) {
    pcVar20 = indent();
    write_c("%s%s->hide();\n",pcVar20,pcStack_20);
  }
  uVar14 = Fl_Widget::active(this->o);
  if (uVar14 == 0) {
    pcVar20 = indent();
    write_c("%s%s->deactivate();\n",pcVar20,pcStack_20);
  }
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x20])();
  if ((iVar5 == 0) && (uVar1 = resizable(this), uVar1 != '\0')) {
    pcVar20 = indent();
    write_c("%sFl_Group::current()->resizable(%s);\n",pcVar20,pcStack_20);
  }
  uVar1 = hotspot(this);
  if (uVar1 != '\0') {
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x26])();
    if (iVar5 == 0) {
      iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])();
      if (iVar5 == 0) {
        pcVar20 = indent();
        write_c("%s%s->window()->hotspot(%s);\n",pcVar20,pcStack_20,pcStack_20);
      }
      else {
        pcVar20 = indent();
        write_c("%s%s->hotspot(%s);\n",pcVar20,pcStack_20,pcStack_20);
      }
    }
    else {
      pcVar20 = indent();
      write_c("%shotspot(%s);\n",pcVar20,pcStack_20);
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::write_widget_code() {
  Fl_Widget* tplate = ((Fl_Widget_Type*)factory)->o;
  const char *var = is_class() ? "this" : name() ? name() : "o";

  if (tooltip() && *tooltip()) {
    write_c("%s%s->tooltip(",indent(), var);
    switch (i18n_type) {
    case 0 : /* None */
        write_cstring(tooltip());
        break;
    case 1 : /* GNU gettext */
        write_c("%s(", i18n_function);
        write_cstring(tooltip());
	write_c(")");
        break;
    case 2 : /* POSIX catgets */
        write_c("catgets(%s,%s,%d,", i18n_file[0] ? i18n_file : "_catalog",
	        i18n_set, msgnum() + 1);
        write_cstring(tooltip());
	write_c(")");
        break;
    }
    write_c(");\n");
  }

  if (is_spinner() && ((Fl_Spinner*)o)->type() != ((Fl_Spinner*)tplate)->type())
    write_c("%s%s->type(%d);\n", indent(), var, ((Fl_Spinner*)o)->type());
  else if (o->type() != tplate->type() && !is_window())
    write_c("%s%s->type(%d);\n", indent(), var, o->type());
  if (o->box() != tplate->box() || subclass())
    write_c("%s%s->box(FL_%s);\n", indent(), var, boxname(o->box()));

  // write shortcut command if needed
  int shortcut = 0;
  if (is_button()) shortcut = ((Fl_Button*)o)->shortcut();
  else if (is_input()) shortcut = ((Fl_Input_*)o)->shortcut();
  else if (is_value_input()) shortcut = ((Fl_Value_Input*)o)->shortcut();
  else if (is_text_display()) shortcut = ((Fl_Text_Display*)o)->shortcut();
  if (shortcut) {
    if (use_FL_COMMAND && (shortcut & (FL_CTRL|FL_META))) {
      write_c("%s%s->shortcut(FL_COMMAND|0x%x);\n", indent(), var, shortcut & ~(FL_CTRL|FL_META));
    } else {
      write_c("%s%s->shortcut(0x%x);\n", indent(), var, shortcut);
    }
  }

  if (is_button()) {
    Fl_Button* b = (Fl_Button*)o;
    if (b->down_box()) write_c("%s%s->down_box(FL_%s);\n", indent(), var,
			       boxname(b->down_box()));
    if (b->value()) write_c("%s%s->value(1);\n", indent(), var);
  } else if (!strcmp(type_name(), "Fl_Input_Choice")) {
    Fl_Input_Choice* b = (Fl_Input_Choice*)o;
    if (b->down_box()) write_c("%s%s->down_box(FL_%s);\n", indent(), var,
			       boxname(b->down_box()));
  } else if (is_menu_button()) {
    Fl_Menu_* b = (Fl_Menu_*)o;
    if (b->down_box()) write_c("%s%s->down_box(FL_%s);\n", indent(), var,
			       boxname(b->down_box()));
  }
  if (o->color() != tplate->color() || subclass())
    write_color("color", o->color());
  if (o->selection_color() != tplate->selection_color() || subclass())
    write_color("selection_color", o->selection_color());
  if (image) image->write_code(var);
  if (inactive) inactive->write_code(var, 1);
  if (o->labeltype() != tplate->labeltype() || subclass())
    write_c("%s%s->labeltype(FL_%s);\n", indent(), var,
	    item_name(labeltypemenu, o->labeltype()));
  if (o->labelfont() != tplate->labelfont() || subclass())
    write_c("%s%s->labelfont(%d);\n", indent(), var, o->labelfont());
  if (o->labelsize() != tplate->labelsize() || subclass())
    write_c("%s%s->labelsize(%d);\n", indent(), var, o->labelsize());
  if (o->labelcolor() != tplate->labelcolor() || subclass())
    write_color("labelcolor", o->labelcolor());
  if (is_valuator()) {
    Fl_Valuator* v = (Fl_Valuator*)o;
    Fl_Valuator* f = (Fl_Valuator*)(tplate);
    if (v->minimum()!=f->minimum())
      write_c("%s%s->minimum(%g);\n", indent(), var, v->minimum());
    if (v->maximum()!=f->maximum())
      write_c("%s%s->maximum(%g);\n", indent(), var, v->maximum());
    if (v->step()!=f->step())
      write_c("%s%s->step(%g);\n", indent(), var, v->step());
    if (v->value()) {
      if (is_valuator()==3) { // Fl_Scrollbar::value(double) is nott available
        write_c("%s%s->Fl_Slider::value(%g);\n", indent(), var, v->value());
      } else {
        write_c("%s%s->value(%g);\n", indent(), var, v->value());
      }
    }
    if (is_valuator()>=2) {
      double x = ((Fl_Slider*)v)->slider_size();
      double y = ((Fl_Slider*)f)->slider_size();
      if (x != y) write_c("%s%s->slider_size(%g);\n", indent(), var, x);
    }
  }
  if (is_spinner()) {
    Fl_Spinner* v = (Fl_Spinner*)o;
    Fl_Spinner* f = (Fl_Spinner*)(tplate);
    if (v->minimum()!=f->minimum())
      write_c("%s%s->minimum(%g);\n", indent(), var, v->minimum());
    if (v->maximum()!=f->maximum())
      write_c("%s%s->maximum(%g);\n", indent(), var, v->maximum());
    if (v->step()!=f->step())
      write_c("%s%s->step(%g);\n", indent(), var, v->step());
    if (v->value()!=1.0f)
      write_c("%s%s->value(%g);\n", indent(), var, v->value());
  }

  {Fl_Font ff; int fs; Fl_Color fc; if (textstuff(4,ff,fs,fc)) {
    Fl_Font f; int s; Fl_Color c; textstuff(0,f,s,c);
    if (f != ff) write_c("%s%s->textfont(%d);\n", indent(), var, f);
    if (s != fs) write_c("%s%s->textsize(%d);\n", indent(), var, s);
    if (c != fc) write_color("textcolor", c);
  }}
  const char* ud = user_data();
  if (class_name(1) && !parent->is_widget()) ud = "this";
  if (callback()) {
    write_c("%s%s->callback((Fl_Callback*)%s", indent(), var, callback_name());
    if (ud)
      write_c(", (void*)(%s));\n", ud);
    else
      write_c(");\n");
  } else if (ud) {
    write_c("%s%s->user_data((void*)(%s));\n", indent(), var, ud);
  }
  if (o->align() != tplate->align() || subclass()) {
    int i = o->align();
    write_c("%s%s->align(Fl_Align(%s", indent(), var,
	    item_name(alignmenu, i & ~FL_ALIGN_INSIDE));
    if (i & FL_ALIGN_INSIDE) write_c("|FL_ALIGN_INSIDE");
    write_c("));\n");
  }
  // avoid the unsupported combination of flegs when user sets 
  // "when" to "FL_WHEN_NEVER", but keeps the "no change" set. 
  // FIXME: This could be reflected in the GUI by graying out the button.
  Fl_When ww = o->when();
  if (ww==FL_WHEN_NOT_CHANGED)
    ww = FL_WHEN_NEVER;
  if (ww != tplate->when() || subclass())
    write_c("%s%s->when(%s);\n", indent(), var,
            item_name(whensymbolmenu, ww));
  if (!o->visible() && o->parent())
    write_c("%s%s->hide();\n", indent(), var);
  if (!o->active())
    write_c("%s%s->deactivate();\n", indent(), var);
  if (!is_group() && resizable())
    write_c("%sFl_Group::current()->resizable(%s);\n", indent(), var);
  if (hotspot()) {
    if (is_class())
      write_c("%shotspot(%s);\n", indent(), var);
    else if (is_window())
      write_c("%s%s->hotspot(%s);\n", indent(), var, var);
    else
      write_c("%s%s->window()->hotspot(%s);\n", indent(), var, var);
  }
}